

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evutil.c
# Opt level: O2

int evutil_eventfd_(uint initval,int flags)

{
  int iVar1;
  int iVar2;
  
  iVar1 = eventfd(initval,flags);
  if (flags == 0 || -1 < iVar1) {
    return iVar1;
  }
  iVar1 = eventfd(initval,0);
  if (iVar1 < 0) {
    return iVar1;
  }
  if ((((uint)flags >> 0x13 & 1) == 0) ||
     (iVar2 = evutil_fast_socket_closeonexec(iVar1), -1 < iVar2)) {
    if (((uint)flags >> 0xb & 1) == 0) {
      return iVar1;
    }
    iVar2 = evutil_fast_socket_nonblocking(iVar1);
    if (-1 < iVar2) {
      return iVar1;
    }
  }
  close(iVar1);
  return -1;
}

Assistant:

evutil_socket_t
evutil_eventfd_(unsigned initval, int flags)
{
#if defined(EVENT__HAVE_EVENTFD) && defined(EVENT__HAVE_SYS_EVENTFD_H)
	int r;
#if defined(EFD_CLOEXEC) && defined(EFD_NONBLOCK)
	r = eventfd(initval, flags);
	if (r >= 0 || flags == 0)
		return r;
#endif
	r = eventfd(initval, 0);
	if (r < 0)
		return r;
	if (flags & EVUTIL_EFD_CLOEXEC) {
		if (evutil_fast_socket_closeonexec(r) < 0) {
			evutil_closesocket(r);
			return -1;
		}
	}
	if (flags & EVUTIL_EFD_NONBLOCK) {
		if (evutil_fast_socket_nonblocking(r) < 0) {
			evutil_closesocket(r);
			return -1;
		}
	}
	return r;
#else
	return -1;
#endif
}